

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_array.h
# Opt level: O3

void __thiscall
agg::pod_vector<agg::rasterizer_cells_aa<agg::cell_aa>::sorted_y>::capacity
          (pod_vector<agg::rasterizer_cells_aa<agg::cell_aa>::sorted_y> *this,uint cap,
          uint extra_tail)

{
  sorted_y *psVar1;
  uint uVar2;
  
  this->m_size = 0;
  if (this->m_capacity < cap) {
    if (this->m_array != (sorted_y *)0x0) {
      operator_delete__(this->m_array);
    }
    uVar2 = extra_tail + cap;
    this->m_capacity = uVar2;
    if (uVar2 == 0) {
      psVar1 = (sorted_y *)0x0;
    }
    else {
      psVar1 = (sorted_y *)operator_new__((ulong)uVar2 << 3);
    }
    this->m_array = psVar1;
  }
  return;
}

Assistant:

void pod_vector<T>::capacity(unsigned cap, unsigned extra_tail)
    {
        m_size = 0;
        if(cap > m_capacity)
        {
            pod_allocator<T>::deallocate(m_array, m_capacity);
            m_capacity = cap + extra_tail;
            m_array = m_capacity ? pod_allocator<T>::allocate(m_capacity) : 0;
        }
    }